

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O0

decode_result __thiscall
jessilib::decode_codepoint_utf16<char16_t>
          (jessilib *this,basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string)

{
  value_type_conflict1 vVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  decode_result dVar5;
  undefined1 auStack_28 [4];
  char32_t codepoint;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_local;
  size_t local_10;
  
  in_string_local._M_len = in_string._M_len;
  _auStack_28 = this;
  bVar2 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty
                    ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28);
  if (bVar2) {
    in_string_local._M_str._0_4_ = 0;
    local_10 = 0;
  }
  else {
    pvVar3 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::front
                       ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28);
    bVar2 = is_high_surrogate((uint)(ushort)*pvVar3);
    if ((bVar2) &&
       (sVar4 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::size
                          ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28),
       1 < sVar4)) {
      pvVar3 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::operator[]
                         ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28,1);
      bVar2 = is_low_surrogate((uint)(ushort)*pvVar3);
      if (bVar2) {
        pvVar3 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::front
                           ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28);
        vVar1 = *pvVar3;
        pvVar3 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::operator[]
                           ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28,1
                           );
        in_string_local._M_str._0_4_ =
             ((ushort)vVar1 - 0xd800) * 0x400 + (uint)(ushort)*pvVar3 + 0x2400;
        local_10 = 2;
        goto LAB_0030495d;
      }
    }
    pvVar3 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::front
                       ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)auStack_28);
    in_string_local._M_str._0_4_ = (uint)(ushort)*pvVar3;
    local_10 = 1;
  }
LAB_0030495d:
  dVar5._4_4_ = 0;
  dVar5.codepoint = (uint)in_string_local._M_str;
  dVar5.units = local_10;
  return dVar5;
}

Assistant:

constexpr decode_result decode_codepoint_utf16(std::basic_string_view<CharT> in_string) {
	if (in_string.empty()) {
		return { 0, 0 };
	}

	if (is_high_surrogate(in_string.front()) // If this is a high surrogate codepoint...
		&& in_string.size() > 1 // And a codepoint follows this surrogate..
		&& is_low_surrogate(in_string[1])) { // And that codepoint is a low surrogate...
		// We have a valid surrogate pair; decode it into a codepoint and return
		char32_t codepoint { static_cast<char32_t>(
			((in_string.front() - 0xD800U) * 0x400U) // high surrogate magic
				+ (in_string[1] - 0xDC00U) // low surrogate magic
				+ 0x10000ULL // more magic
		) };

		return { codepoint, 2 };
	}

	// Codepoint is a single char16_t; return codepoint directly
	return { in_string.front(), 1 };
}